

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4be406::PpuTest_ignore_oamdata_during_pre_render_scanline_Test::
~PpuTest_ignore_oamdata_during_pre_render_scanline_Test
          (PpuTest_ignore_oamdata_during_pre_render_scanline_Test *this)

{
  IPpu *pIVar1;
  void *in_RAX;
  
  (this->super_PpuTest).super_Test._vptr_Test = (_func_int **)&PTR__PpuTest_002ae680;
  pIVar1 = (this->super_PpuTest).ppu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
           super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl;
  if (pIVar1 != (IPpu *)0x0) {
    (*pIVar1->_vptr_IPpu[1])();
  }
  (this->super_PpuTest).ppu._M_t.
  super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
  super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl = (IPpu *)0x0;
  (this->super_PpuTest).mmu.super_MockMmu.super_IMmu._vptr_IMmu =
       (_func_int **)&PTR__MockMmu_002a0898;
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_char)>::~FunctionMocker
            (&(this->super_PpuTest).mmu.super_MockMmu.gmock02_write_byte_15);
  testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::~FunctionMocker
            (&(this->super_PpuTest).mmu.super_MockMmu.gmock11_read_byte_14);
  testing::internal::
  FunctionMocker<void_(std::vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>)>
  ::~FunctionMocker(&(this->super_PpuTest).mmu.super_MockMmu.gmock01_set_mem_banks_12);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x138);
  return;
}

Assistant:

TEST_F(PpuTest, ignore_oamdata_during_pre_render_scanline) {
    registers.mask = PpuMask(0b00011000);
    registers.oamaddr = 0x02;
    registers.scanline = 261;
    registers.odd_frame = true;
    expected.mask = registers.mask;
    expected.oamaddr = registers.oamaddr;
    expected.scanline = 0;
    expected.odd_frame = false;
    // Two increases when fetching two tiles for next scanline
    expected.vram_addr = PpuVram(0x0002);

    step_execution(kCyclesPerScanline);

    ppu->write_byte(0x2004, 0x73);

    EXPECT_EQ(expected, registers);
}